

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nlohmann::json_abi_v3_11_3::detail::
concat<std::__cxx11::string,char_const*,char_const(&)[15],std::__cxx11::string,char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,char **args,char (*args_1) [15],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,char *args_3)

{
  size_t __res;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __res = concat_length<char[15],std::__cxx11::string,char>
                    (*(char **)this,(char (*) [15])args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
                     (char *)args_2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,__res);
  concat_into<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            (__return_storage_ptr__,(char **)this,(char (*) [15])args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
             (char *)args_2);
  return __return_storage_ptr__;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(args...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}